

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::abstract_value<std::vector<signed_char,_std::allocator<signed_char>_>_>::
~abstract_value(abstract_value<std::vector<signed_char,_std::allocator<signed_char>_>_> *this)

{
  abstract_value<std::vector<signed_char,_std::allocator<signed_char>_>_> *this_local;
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_00373588;
  std::__cxx11::string::~string((string *)&this->m_implicit_value);
  std::__cxx11::string::~string((string *)&this->m_default_value);
  std::shared_ptr<std::vector<signed_char,_std::allocator<signed_char>_>_>::~shared_ptr
            (&this->m_result);
  Value::~Value(&this->super_Value);
  return;
}

Assistant:

~abstract_value() override = default;